

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lvm.c
# Opt level: O0

int luaV_forlimit(TValue *obj,lua_Integer *p,lua_Integer step,int *stopnow)

{
  int iVar1;
  F2Imod mode;
  double local_38;
  lua_Number n;
  int *stopnow_local;
  lua_Integer step_local;
  lua_Integer *p_local;
  TValue *obj_local;
  
  *stopnow = 0;
  n = (lua_Number)stopnow;
  stopnow_local = (int *)step;
  step_local = (lua_Integer)p;
  p_local = (lua_Integer *)obj;
  if (obj->tt_ == 0x13) {
    if (obj->tt_ != 0x13) {
      __assert_fail("((((obj))->tt_) == (((3) | ((1) << 4))))",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                    ,0xbb,"int luaV_forlimit(const TValue *, lua_Integer *, lua_Integer, int *)");
    }
    *p = (lua_Integer)obj->value_;
  }
  else {
    mode = F2Ifloor;
    if (step < 0) {
      mode = F2Iceil;
    }
    iVar1 = luaV_tointeger(obj,p,mode);
    if (iVar1 == 0) {
      if ((short)p_local[1] == 3) {
        if ((short)p_local[1] != 3) {
          __assert_fail("((((obj))->tt_) == (((3) | ((0) << 4))))",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                        ,0xbf,"int luaV_forlimit(const TValue *, lua_Integer *, lua_Integer, int *)"
                       );
        }
        local_38 = (double)*p_local;
      }
      else {
        iVar1 = luaV_tonumber_((TValue *)p_local,&local_38);
        if (iVar1 == 0) {
          return 0;
        }
      }
      if (local_38 <= 0.0) {
        *(undefined8 *)step_local = 0x8000000000000000;
        if (-1 < (long)stopnow_local) {
          *(undefined4 *)n = 1;
        }
      }
      else {
        *(undefined8 *)step_local = 0x7fffffffffffffff;
        if ((long)stopnow_local < 0) {
          *(undefined4 *)n = 1;
        }
      }
    }
  }
  return 1;
}

Assistant:

int luaV_forlimit (const TValue *obj, lua_Integer *p, lua_Integer step,
                     int *stopnow) {
  *stopnow = 0;  /* usually, let loops run */
  if (ttisinteger(obj))
    *p = ivalue(obj);
  else if (!luaV_tointeger(obj, p, (step < 0 ? F2Iceil : F2Ifloor))) {
    /* not coercible to in integer */
    lua_Number n;  /* try to convert to float */
    if (!tonumber(obj, &n)) /* cannot convert to float? */
      return 0;  /* not a number */
    if (luai_numlt(0, n)) {  /* if true, float is larger than max integer */
      *p = LUA_MAXINTEGER;
      if (step < 0) *stopnow = 1;
    }
    else {  /* float is smaller than min integer */
      *p = LUA_MININTEGER;
      if (step >= 0) *stopnow = 1;
    }
  }
  return 1;
}